

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubBoard.cpp
# Opt level: O1

void __thiscall SubBoard::SubBoard(SubBoard *this)

{
  ChunkDrawable *this_00;
  pointer *__ptr;
  void *local_30;
  
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Drawable_0027b310;
  LodRenderer::LodRenderer(&this->super_LodRenderer);
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__SubBoard_0027c0d8;
  (this->super_LodRenderer)._vptr_LodRenderer = (_func_int **)&PTR__SubBoard_0027c108;
  (this->chunks_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->chunks_)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->chunks_)._M_h._M_rehash_policy = 0;
  (this->chunks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->chunks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->super_LodRenderer).field_0x2c = 0;
  (this->size_).x = 0;
  (this->size_).y = 0;
  (this->lastSize_).x = 0;
  (this->lastSize_).y = 0;
  (this->chunks_)._M_h._M_buckets = &(this->chunks_)._M_h._M_single_bucket;
  (this->chunks_)._M_h._M_bucket_count = 1;
  (this->chunks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->chunks_)._M_h._M_element_count = 0;
  (this->chunks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->chunks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->chunks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_30 = (void *)0x0;
  details::make_unique<Chunk,_std::nullptr_t,_const_unsigned_long_&,_0>
            ((details *)&this->emptyChunk_,&local_30,&LodRenderer::EMPTY_CHUNK_COORDS);
  (this->chunkDrawables_).vec_.
  super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chunkDrawables_).vec_.
  super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunkDrawables_).vec_.
  super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->visibleArea_).left = 0;
  (this->visibleArea_).top = 0;
  (this->visibleArea_).width = 0;
  (this->visibleArea_).height = 0;
  (this->lastVisibleArea_).left = 0;
  (this->lastVisibleArea_).top = 0;
  (this->lastVisibleArea_).width = 0;
  (this->lastVisibleArea_).height = 0;
  this->lastTileset_ = (Texture *)0x0;
  sf::RenderTexture::RenderTexture(&this->texture_);
  sf::VertexArray::VertexArray(&this->vertices_,Triangles,6);
  this_00 = FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::operator[]
                      (&this->chunkDrawables_,&LodRenderer::EMPTY_CHUNK_COORDS);
  ChunkDrawable::setChunk
            (this_00,(this->emptyChunk_)._M_t.
                     super___uniq_ptr_impl<Chunk,_std::default_delete<Chunk>_>._M_t.
                     super__Tuple_impl<0UL,_Chunk_*,_std::default_delete<Chunk>_>.
                     super__Head_base<0UL,_Chunk_*,_false>._M_head_impl);
  return;
}

Assistant:

SubBoard::SubBoard() :
    position_(),
    size_(),
    lastSize_(),
    chunks_(),
    emptyChunk_(details::make_unique<Chunk>(nullptr, LodRenderer::EMPTY_CHUNK_COORDS)),
    chunkDrawables_(),
    visibleArea_(0, 0, 0, 0),
    lastVisibleArea_(0, 0, 0, 0),
    lastTileset_(nullptr),
    texture_(),
    vertices_(sf::Triangles, 6) {

    chunkDrawables_[LodRenderer::EMPTY_CHUNK_COORDS].setChunk(emptyChunk_.get());
}